

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONTestPresets.cxx
# Opt level: O0

bool anon_unknown.dwarf_276557::TestPresetExecutionShowOnlyHelper
               (ShowOnlyEnum *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  String local_68;
  String local_48;
  cmJSONState *local_28;
  cmJSONState *state_local;
  Value *value_local;
  ShowOnlyEnum *out_local;
  
  local_28 = state;
  state_local = (cmJSONState *)value;
  value_local = (Value *)out;
  if ((value == (Value *)0x0) || (bVar1 = Json::Value::isString(value), !bVar1)) {
    cmCMakePresetsErrors::INVALID_PRESET((Value *)state_local,local_28);
    return false;
  }
  Json::Value::asString_abi_cxx11_(&local_48,(Value *)state_local);
  bVar1 = std::operator==(&local_48,"human");
  std::__cxx11::string::~string((string *)&local_48);
  if (bVar1) {
    *(undefined4 *)&value_local->value_ = 0;
    return true;
  }
  Json::Value::asString_abi_cxx11_(&local_68,(Value *)state_local);
  bVar1 = std::operator==(&local_68,"json-v1");
  std::__cxx11::string::~string((string *)&local_68);
  if (!bVar1) {
    cmCMakePresetsErrors::INVALID_PRESET((Value *)state_local,local_28);
    return false;
  }
  *(undefined4 *)&value_local->value_ = 1;
  return true;
}

Assistant:

bool TestPresetExecutionShowOnlyHelper(
  TestPreset::ExecutionOptions::ShowOnlyEnum& out, const Json::Value* value,
  cmJSONState* state)
{
  if (!value || !value->isString()) {
    cmCMakePresetsErrors::INVALID_PRESET(value, state);
    return false;
  }

  if (value->asString() == "human") {
    out = TestPreset::ExecutionOptions::ShowOnlyEnum::Human;
    return true;
  }

  if (value->asString() == "json-v1") {
    out = TestPreset::ExecutionOptions::ShowOnlyEnum::JsonV1;
    return true;
  }

  cmCMakePresetsErrors::INVALID_PRESET(value, state);
  return false;
}